

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O3

Span * tcmalloc::NewSpan(uint64_t page_id,uint64_t npages)

{
  Span *pSVar1;
  
  pSVar1 = FixedAllocator<tcmalloc::Span>::Alloc((FixedAllocator<tcmalloc::Span> *)span_allocator);
  pSVar1->prev = (Span *)0x0;
  pSVar1->page_id = page_id;
  pSVar1->npages = npages;
  pSVar1->refcount = 0;
  return pSVar1;
}

Assistant:

Span* NewSpan(uint64_t page_id, uint64_t npages) {
    Span* span = span_allocator.Alloc();
    memset(span, 0, sizeof(span));
    span->page_id = page_id;
    span->npages = npages;
    span->refcount = 0;
    return span;
}